

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# labeling_lacassagne_2016_code.inc.h
# Opt level: O1

void __thiscall
LSL_RLEZ<TTA>::PerformLabelingMem
          (LSL_RLEZ<TTA> *this,vector<unsigned_long,_std::allocator<unsigned_long>_> *accesses)

{
  int *piVar1;
  uint uVar2;
  uint uVar3;
  Mat *m;
  Mat1b *pMVar4;
  pointer puVar5;
  pointer piVar6;
  vector<unsigned_long,_std::allocator<unsigned_long>_> *pvVar7;
  undefined1 auVar8 [8];
  undefined1 auVar9 [8];
  int iVar10;
  uint uVar11;
  int iVar12;
  long lVar13;
  ulong uVar14;
  long lVar15;
  long lVar16;
  ulong uVar17;
  long lVar18;
  long lVar19;
  long lVar20;
  long lVar21;
  uint uVar22;
  ulong uVar23;
  double dVar24;
  MemVector<int> ner;
  MemMat<int> ERA;
  MemMat<int> RLC;
  MemMat<int> ER;
  MemMat<int> labels;
  MemMat<int> img;
  MemVector<int> local_540;
  vector<unsigned_long,_std::allocator<unsigned_long>_> *local_510;
  long *local_508;
  long local_500;
  long *local_4f8;
  undefined4 local_4f0;
  Mat *local_4e8;
  undefined8 local_4e0;
  undefined1 local_4d8 [8];
  void *pvStack_4d0;
  Size local_4c8;
  undefined1 local_478 [104];
  Mat local_410 [16];
  long local_400;
  long *local_3c8;
  undefined1 local_3b0 [104];
  Mat local_348 [16];
  long local_338;
  long *local_300;
  undefined1 local_2e8 [104];
  Mat local_280 [16];
  long local_270;
  long *local_238;
  undefined1 local_220 [104];
  Mat local_1b8 [16];
  long local_1a8;
  long *local_170;
  undefined1 local_158 [104];
  Mat local_f0 [16];
  long local_e0;
  long *local_a8;
  Mat_<int> local_90;
  
  m = &((this->super_Labeling2D<(Connectivity2D)8,_false>).img_)->super_Mat;
  uVar2 = *(uint *)(m + 8);
  uVar14 = (ulong)uVar2;
  uVar3 = *(uint *)(m + 0xc);
  cv::Mat::Mat(&local_90.super_Mat);
  local_90._0_4_ = local_90._0_4_ & 0xfffff000 | 4;
  cv::Mat_<int>::operator=((Mat_<int> *)&local_90.super_Mat,m);
  MemMat<int>::MemMat((MemMat<int> *)local_158,&local_90);
  cv::Mat::~Mat(&local_90.super_Mat);
  local_3b0._0_4_ = uVar3;
  local_3b0._4_4_ = uVar2;
  MemMat<int>::MemMat((MemMat<int> *)local_2e8,(Size *)local_3b0);
  local_478._0_4_ = uVar3 + 1 & 0xfffffffe;
  local_478._4_4_ = uVar2;
  MemMat<int>::MemMat((MemMat<int> *)local_3b0,(Size *)local_478);
  local_510 = accesses;
  MemVector<int>::MemVector(&local_540,(long)(int)uVar2);
  if (0 < (int)uVar2) {
    local_4f8 = local_300;
    local_500 = local_3b0._24_8_;
    local_508 = (long *)local_3b0._80_8_;
    uVar17 = 0;
    do {
      uVar11 = 0;
      iVar10 = 0;
      if (0 < (int)uVar3) {
        lVar18 = *local_238;
        lVar16 = *(long *)local_2e8._80_8_;
        lVar19 = *(long *)local_158._80_8_;
        lVar13 = *local_a8;
        uVar23 = 0;
        iVar10 = 0;
        uVar22 = 0;
        do {
          piVar1 = (int *)(lVar13 * uVar17 + local_e0 + uVar23 * 4);
          *piVar1 = *piVar1 + 1;
          uVar11 = (uint)(0 < *(int *)(lVar19 * uVar17 + local_158._24_8_ + uVar23 * 4));
          if (uVar22 != uVar11) {
            piVar1 = (int *)(*local_300 * uVar17 + local_338 + (long)iVar10 * 4);
            *piVar1 = *piVar1 + 1;
            *(int *)(*(long *)local_3b0._80_8_ * uVar17 + local_3b0._24_8_ + (long)iVar10 * 4) =
                 (int)uVar23;
            iVar10 = iVar10 + 1;
          }
          piVar1 = (int *)(lVar18 * uVar17 + local_270 + uVar23 * 4);
          *piVar1 = *piVar1 + 1;
          *(int *)(lVar16 * uVar17 + local_2e8._24_8_ + uVar23 * 4) = iVar10;
          uVar23 = uVar23 + 1;
          uVar22 = uVar11;
        } while (uVar3 != uVar23);
      }
      if (uVar11 != 0) {
        piVar1 = (int *)(*local_300 * uVar17 + local_338 + (long)iVar10 * 4);
        *piVar1 = *piVar1 + 1;
        *(uint *)(*(long *)local_3b0._80_8_ * uVar17 + local_3b0._24_8_ + (long)iVar10 * 4) = uVar3;
      }
      local_540.accesses_.super__Vector_base<int,_std::allocator<int>_>._M_impl.
      super__Vector_impl_data._M_start[uVar17] =
           local_540.accesses_.super__Vector_base<int,_std::allocator<int>_>._M_impl.
           super__Vector_impl_data._M_start[uVar17] + 1;
      local_540.vec_.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_start[uVar17] = iVar10 + uVar11;
      uVar17 = uVar17 + 1;
    } while (uVar17 != uVar14);
  }
  local_220._0_4_ = uVar3 + 1;
  local_220._4_4_ = uVar2;
  MemMat<int>::MemMat((MemMat<int> *)local_478,(Size *)local_220,0);
  pMVar4 = (this->super_Labeling2D<(Connectivity2D)8,_false>).img_;
  iVar10 = *(int *)&pMVar4->field_0x8;
  iVar12 = *(int *)&pMVar4->field_0xc;
  TTA::MemAlloc(((iVar12 - (iVar12 + 1 >> 0x1f)) + 1 >> 1) *
                ((iVar10 - (iVar10 + 1 >> 0x1f)) + 1 >> 1) + 1);
  *TTA::mem_rtable_.accesses_.super__Vector_base<int,_std::allocator<int>_>._M_impl.
   super__Vector_impl_data._M_start =
       *TTA::mem_rtable_.accesses_.super__Vector_base<int,_std::allocator<int>_>._M_impl.
        super__Vector_impl_data._M_start + 1;
  *TTA::mem_rtable_.vec_.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
   super__Vector_impl_data._M_start = 0;
  TTA::length_ = 1;
  *local_540.accesses_.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data
   ._M_start = *local_540.accesses_.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                super__Vector_impl_data._M_start + 1;
  if (0 < *local_540.vec_.super__Vector_base<int,_std::allocator<int>_>._M_impl.
           super__Vector_impl_data._M_start) {
    lVar18 = 1;
    do {
      uVar11 = TTA::MemNewLabel();
      piVar1 = (int *)(local_400 + lVar18 * 4);
      *piVar1 = *piVar1 + 1;
      *(uint *)(local_478._24_8_ + lVar18 * 4) = uVar11;
      *local_540.accesses_.super__Vector_base<int,_std::allocator<int>_>._M_impl.
       super__Vector_impl_data._M_start =
           *local_540.accesses_.super__Vector_base<int,_std::allocator<int>_>._M_impl.
            super__Vector_impl_data._M_start + 1;
      lVar18 = lVar18 + 2;
    } while ((int)lVar18 <=
             *local_540.vec_.super__Vector_base<int,_std::allocator<int>_>._M_impl.
              super__Vector_impl_data._M_start);
  }
  if (1 < (int)uVar2) {
    uVar17 = 1;
    lVar18 = 0;
    do {
      local_540.accesses_.super__Vector_base<int,_std::allocator<int>_>._M_impl.
      super__Vector_impl_data._M_start[uVar17] =
           local_540.accesses_.super__Vector_base<int,_std::allocator<int>_>._M_impl.
           super__Vector_impl_data._M_start[uVar17] + 1;
      if (0 < local_540.vec_.super__Vector_base<int,_std::allocator<int>_>._M_impl.
              super__Vector_impl_data._M_start[uVar17]) {
        lVar16 = uVar17 - 1;
        lVar19 = 1;
        do {
          lVar13 = *local_300 * uVar17 + local_338;
          piVar1 = (int *)(lVar13 + -4 + lVar19 * 4);
          *piVar1 = *piVar1 + 1;
          lVar15 = *(long *)local_3b0._80_8_ * uVar17 + local_3b0._24_8_;
          iVar10 = *(int *)(lVar15 + -4 + lVar19 * 4);
          piVar1 = (int *)(lVar13 + lVar19 * 4);
          *piVar1 = *piVar1 + 1;
          iVar12 = *(int *)(lVar15 + lVar19 * 4);
          lVar15 = *local_238 * lVar16 + local_270;
          lVar13 = (long)(int)(iVar10 - (uint)(0 < iVar10));
          piVar1 = (int *)(lVar15 + lVar13 * 4);
          *piVar1 = *piVar1 + 1;
          lVar20 = *(long *)local_2e8._80_8_ * lVar16 + local_2e8._24_8_;
          iVar10 = *(int *)(lVar20 + lVar13 * 4);
          lVar13 = (long)(int)(iVar12 - (uint)((int)uVar3 <= iVar12));
          piVar1 = (int *)(lVar15 + lVar13 * 4);
          *piVar1 = *piVar1 + 1;
          uVar11 = *(uint *)(lVar20 + lVar13 * 4);
          uVar23 = (long)iVar10 | 1;
          iVar10 = uVar11 + (uVar11 & 1) + -1;
          if (iVar10 < (int)uVar23) {
            uVar11 = TTA::MemNewLabel();
          }
          else {
            piVar1 = (int *)(*local_3c8 * lVar16 + local_400 + uVar23 * 4);
            *piVar1 = *piVar1 + 1;
            iVar12 = *(int *)(*(long *)local_478._80_8_ * lVar16 + local_478._24_8_ + uVar23 * 4);
            TTA::mem_rtable_.accesses_.super__Vector_base<int,_std::allocator<int>_>._M_impl.
            super__Vector_impl_data._M_start[iVar12] =
                 TTA::mem_rtable_.accesses_.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                 super__Vector_impl_data._M_start[iVar12] + 1;
            uVar11 = TTA::mem_rtable_.vec_.
                     super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                     super__Vector_impl_data._M_start[iVar12];
            iVar12 = (int)uVar23 + 2;
            if (iVar12 <= iVar10) {
              lVar13 = (long)iVar12;
              do {
                piVar1 = (int *)(*local_3c8 * lVar18 + local_400 + lVar13 * 4);
                *piVar1 = *piVar1 + 1;
                iVar12 = *(int *)(*(long *)local_478._80_8_ * lVar18 + local_478._24_8_ + lVar13 * 4
                                 );
                TTA::mem_rtable_.accesses_.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                super__Vector_impl_data._M_start[iVar12] =
                     TTA::mem_rtable_.accesses_.super__Vector_base<int,_std::allocator<int>_>.
                     _M_impl.super__Vector_impl_data._M_start[iVar12] + 1;
                uVar22 = TTA::mem_rtable_.vec_.
                         super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                         super__Vector_impl_data._M_start[iVar12];
                if ((int)uVar11 < (int)uVar22) {
                  TTA::MemUpdateTable(uVar22,uVar11);
                }
                if ((int)uVar22 < (int)uVar11) {
                  TTA::MemUpdateTable(uVar11,uVar22);
                  uVar11 = uVar22;
                }
                lVar13 = lVar13 + 2;
              } while (lVar13 <= iVar10);
            }
          }
          piVar1 = (int *)(*local_3c8 * uVar17 + local_400 + lVar19 * 4);
          *piVar1 = *piVar1 + 1;
          *(uint *)(*(long *)local_478._80_8_ * uVar17 + local_478._24_8_ + lVar19 * 4) = uVar11;
          local_540.accesses_.super__Vector_base<int,_std::allocator<int>_>._M_impl.
          super__Vector_impl_data._M_start[uVar17] =
               local_540.accesses_.super__Vector_base<int,_std::allocator<int>_>._M_impl.
               super__Vector_impl_data._M_start[uVar17] + 1;
          lVar19 = lVar19 + 2;
        } while (lVar19 <= local_540.vec_.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                           super__Vector_impl_data._M_start[uVar17]);
      }
      uVar17 = uVar17 + 1;
      lVar18 = lVar18 + 1;
    } while (uVar17 != uVar14);
  }
  uVar11 = TTA::MemFlatten();
  (this->super_Labeling2D<(Connectivity2D)8,_false>).n_labels_ = uVar11;
  local_4d8._4_4_ = uVar2;
  local_4d8._0_4_ = uVar3;
  MemMat<int>::MemMat((MemMat<int> *)local_220,(Size *)local_4d8);
  piVar6 = TTA::mem_rtable_.accesses_.super__Vector_base<int,_std::allocator<int>_>._M_impl.
           super__Vector_impl_data._M_start;
  puVar5 = TTA::mem_rtable_.vec_.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
           _M_impl.super__Vector_impl_data._M_start;
  if (0 < (int)uVar2) {
    uVar17 = 0;
    do {
      if (0 < (int)uVar3) {
        lVar18 = *local_3c8;
        lVar16 = *(long *)local_478._80_8_;
        lVar19 = *local_170;
        lVar13 = *(long *)local_220._80_8_;
        lVar15 = *(long *)local_2e8._80_8_;
        lVar20 = *local_238;
        uVar23 = 0;
        do {
          piVar1 = (int *)(lVar20 * uVar17 + local_270 + uVar23 * 4);
          *piVar1 = *piVar1 + 1;
          lVar21 = (long)*(int *)(lVar15 * uVar17 + local_2e8._24_8_ + uVar23 * 4);
          piVar1 = (int *)(lVar18 * uVar17 + local_400 + lVar21 * 4);
          *piVar1 = *piVar1 + 1;
          iVar10 = *(int *)(lVar16 * uVar17 + local_478._24_8_ + lVar21 * 4);
          piVar6[iVar10] = piVar6[iVar10] + 1;
          uVar2 = puVar5[iVar10];
          piVar1 = (int *)(lVar19 * uVar17 + local_1a8 + uVar23 * 4);
          *piVar1 = *piVar1 + 1;
          *(uint *)(lVar13 * uVar17 + local_220._24_8_ + uVar23 * 4) = uVar2;
          uVar23 = uVar23 + 1;
        } while (uVar3 != uVar23);
      }
      uVar17 = uVar17 + 1;
    } while (uVar17 != uVar14);
  }
  local_4d8._0_4_ = 0;
  local_4d8._4_4_ = 0;
  pvStack_4d0 = (void *)0x0;
  local_4c8.width = 0;
  local_4c8.height = 0;
  local_4d8 = (undefined1  [8])operator_new(0x20);
  pvVar7 = local_510;
  pvStack_4d0 = (void *)((long)local_4d8 + 0x20);
  *(undefined8 *)((long)local_4d8 + 0x10) = 0;
  *(undefined8 *)((long)local_4d8 + 0x18) = 0;
  *(undefined8 *)local_4d8 = 0;
  *(undefined8 *)((long)local_4d8 + 8) = 0;
  local_4c8 = (Size)pvStack_4d0;
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::_M_move_assign(local_510,local_4d8);
  if ((Size)local_4d8 != (Size)0x0) {
    operator_delete((void *)local_4d8,(long)local_4c8 - (long)local_4d8);
  }
  local_4e0 = 0;
  local_4f0 = 0x81010004;
  local_4e8 = local_f0;
  cv::sum((_InputArray *)local_4d8);
  *(pvVar7->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)._M_impl.
   super__Vector_impl_data._M_start =
       (long)((double)local_4d8 - 9.223372036854776e+18) & (long)(double)local_4d8 >> 0x3f |
       (long)(double)local_4d8;
  local_4e0 = 0;
  local_4f0 = 0x81010004;
  local_4e8 = local_1b8;
  cv::sum((_InputArray *)local_4d8);
  (pvVar7->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)._M_impl.
  super__Vector_impl_data._M_start[1] =
       (long)(double)local_4d8 >> 0x3f & (long)((double)local_4d8 - 9.223372036854776e+18) |
       (long)(double)local_4d8;
  dVar24 = TTA::MemTotalAccesses();
  (pvVar7->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)._M_impl.
  super__Vector_impl_data._M_start[2] =
       (long)dVar24 >> 0x3f & (long)(dVar24 - 9.223372036854776e+18) | (long)dVar24;
  local_4e0 = 0;
  local_4f0 = 0x81010004;
  local_4e8 = local_280;
  cv::sum((_InputArray *)local_4d8);
  auVar8 = local_4d8;
  local_4e0 = 0;
  local_4f0 = 0x81010004;
  local_4e8 = local_348;
  cv::sum((_InputArray *)local_4d8);
  auVar9 = local_4d8;
  if ((long)local_540.accesses_.super__Vector_base<int,_std::allocator<int>_>._M_impl.
            super__Vector_impl_data._M_finish -
      (long)local_540.accesses_.super__Vector_base<int,_std::allocator<int>_>._M_impl.
            super__Vector_impl_data._M_start == 0) {
    dVar24 = 0.0;
  }
  else {
    lVar18 = (long)local_540.accesses_.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                   super__Vector_impl_data._M_finish -
             (long)local_540.accesses_.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                   super__Vector_impl_data._M_start >> 2;
    dVar24 = 0.0;
    lVar16 = 0;
    do {
      dVar24 = dVar24 + (double)local_540.accesses_.super__Vector_base<int,_std::allocator<int>_>.
                                _M_impl.super__Vector_impl_data._M_start[lVar16];
      lVar16 = lVar16 + 1;
    } while (lVar18 + (ulong)(lVar18 == 0) != lVar16);
  }
  local_4e0 = 0;
  local_4f0 = 0x81010004;
  local_4e8 = local_410;
  cv::sum((_InputArray *)local_4d8);
  dVar24 = (double)auVar8 + (double)auVar9 + dVar24 + (double)local_4d8;
  uVar14 = (ulong)dVar24;
  (pvVar7->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)._M_impl.
  super__Vector_impl_data._M_start[3] =
       (long)(dVar24 - 9.223372036854776e+18) & (long)uVar14 >> 0x3f | uVar14;
  MemMat<int>::GetImage((Mat_<int> *)local_4d8,(MemMat<int> *)local_220);
  cv::Mat::operator=(&((this->super_Labeling2D<(Connectivity2D)8,_false>).img_labels_)->super_Mat,
                     (Mat *)local_4d8);
  cv::Mat::~Mat((Mat *)local_4d8);
  cv::Mat::~Mat(local_1b8);
  cv::Mat::~Mat((Mat *)(local_220 + 8));
  cv::Mat::~Mat(local_410);
  cv::Mat::~Mat((Mat *)(local_478 + 8));
  if (local_540.accesses_.super__Vector_base<int,_std::allocator<int>_>._M_impl.
      super__Vector_impl_data._M_start != (int *)0x0) {
    operator_delete(local_540.accesses_.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_540.accesses_.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_540.accesses_.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  if (local_540.vec_.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_start != (int *)0x0) {
    operator_delete(local_540.vec_.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_540.vec_.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_540.vec_.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  cv::Mat::~Mat(local_348);
  cv::Mat::~Mat((Mat *)(local_3b0 + 8));
  cv::Mat::~Mat(local_280);
  cv::Mat::~Mat((Mat *)(local_2e8 + 8));
  cv::Mat::~Mat(local_f0);
  cv::Mat::~Mat((Mat *)(local_158 + 8));
  return;
}

Assistant:

void PerformLabelingMem(std::vector<uint64_t>& accesses) {
        int rows = img_.rows;
        int cols = img_.cols;

        MemMat<int> img(img_);

        // Step 1
        MemMat<int> ER(rows, cols);   // Matrix of relative label (1 label/pixel) 
        MemMat<int> RLC(rows, (cols + 1) & ~1); // MISSING in the paper: RLC requires 2 values/run in row, so width must be next multiple of 2
        MemVector<int> ner(rows); //vector<int> ner(rows); // Number of runs 

        for (int r = 0; r < rows; ++r) {
            int x0;
            int x1 = 0; // Previous value of X
            int f = 0;  // Front detection
            ZOA_MOD0
            int er = 0;
            for (int c = 0; c < cols; ++c)
            {
                x0 = img(r, c) > 0;
                f = x0 ^ x1;
                RLE_MOD1{
                    RLC(r, er) = c ZOA_MOD1;
                    ZOA_MOD2
                        er = er + RLE_MOD2;
                }
                ER(r, c) = er;
                x1 = x0;
            }
            ZOA_MOD3
                RLC(r, er) = cols ZOA_MOD1;
            ZOA_MOD4
                ner[r] = er;
        }